

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

void ymf278b_alloc_ram(void *info,UINT32 memsize)

{
  void *pvVar1;
  YMF278BChip *chip;
  UINT32 memsize_local;
  void *info_local;
  
  if (*(UINT32 *)((long)info + 0x530) != memsize) {
    pvVar1 = realloc(*(void **)((long)info + 0x538),(ulong)memsize);
    *(void **)((long)info + 0x538) = pvVar1;
    *(UINT32 *)((long)info + 0x530) = memsize;
    memset(*(void **)((long)info + 0x538),0,(ulong)*(uint *)((long)info + 0x530));
  }
  return;
}

Assistant:

static void ymf278b_alloc_ram(void* info, UINT32 memsize)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	
	if (chip->RAMSize == memsize)
		return;
	
	chip->ram = (UINT8*)realloc(chip->ram, memsize);
	chip->RAMSize = memsize;
	memset(chip->ram, 0, chip->RAMSize);
	
	return;
}